

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_dophase_done(connectdata *conn,_Bool connected)

{
  undefined1 *puVar1;
  void *pvVar2;
  CURLcode CVar3;
  undefined7 in_register_00000031;
  Curl_easy *data;
  int completed;
  int local_1c;
  
  data = conn->data;
  pvVar2 = (data->req).protop;
  if ((int)CONCAT71(in_register_00000031,connected) == 0) {
    if (*(int *)((long)pvVar2 + 0x20) == 0) {
      puVar1 = &(conn->bits).field_0x5;
      *puVar1 = *puVar1 | 8;
      goto LAB_0013c7e2;
    }
  }
  else {
    CVar3 = ftp_do_more(conn,&local_1c);
    if (CVar3 != CURLE_OK) {
      if (conn->sock[1] != -1) {
        Curl_closesocket(conn,conn->sock[1]);
        conn->sock[1] = -1;
      }
      (conn->bits).tcpconnect[1] = false;
      return CVar3;
    }
    if (*(int *)((long)pvVar2 + 0x20) == 0) goto LAB_0013c7e2;
    data = conn->data;
  }
  Curl_setup_transfer(data,-1,-1,false,-1);
LAB_0013c7e2:
  (conn->proto).ftpc.ctl_valid = true;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_dophase_done(struct connectdata *conn,
                                 bool connected)
{
  struct FTP *ftp = conn->data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(connected) {
    int completed;
    CURLcode result = ftp_do_more(conn, &completed);

    if(result) {
      close_secondarysocket(conn);
      return result;
    }
  }

  if(ftp->transfer != FTPTRANSFER_BODY)
    /* no data to transfer */
    Curl_setup_transfer(conn->data, -1, -1, FALSE, -1);
  else if(!connected)
    /* since we didn't connect now, we want do_more to get called */
    conn->bits.do_more = TRUE;

  ftpc->ctl_valid = TRUE; /* seems good */

  return CURLE_OK;
}